

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsBase.hpp
# Opt level: O0

void __thiscall
vkt::sparse::SparseShaderIntrinsicsInstanceBase::SparseShaderIntrinsicsInstanceBase
          (SparseShaderIntrinsicsInstanceBase *this,Context *context,SpirVFunction function,
          ImageType imageType,UVec3 *imageSize,TextureFormat *format)

{
  TextureFormat *format_local;
  UVec3 *imageSize_local;
  ImageType imageType_local;
  SpirVFunction function_local;
  Context *context_local;
  SparseShaderIntrinsicsInstanceBase *this_local;
  
  SparseResourcesBaseInstance::SparseResourcesBaseInstance
            (&this->super_SparseResourcesBaseInstance,context);
  (this->super_SparseResourcesBaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__SparseShaderIntrinsicsInstanceBase_0166d9e8;
  this->m_function = function;
  this->m_imageType = imageType;
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_imageSize,imageSize);
  this->m_format = *format;
  tcu::TextureFormat::TextureFormat(&this->m_residencyFormat,R,UNSIGNED_INT32);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::vector(&this->pipelines);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector(&this->imageSparseViews);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector(&this->imageTexelsViews);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector(&this->imageResidencyViews);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->descriptorPool);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector(&this->descriptorSets);
  return;
}

Assistant:

SparseShaderIntrinsicsInstanceBase		(Context&					context,
											 const SpirVFunction		function,
											 const ImageType			imageType,
											 const tcu::UVec3&			imageSize,
											 const tcu::TextureFormat&	format)
		: SparseResourcesBaseInstance(context)
		, m_function(function)
		, m_imageType(imageType)
		, m_imageSize(imageSize)
		, m_format(format)
		, m_residencyFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT32)
	{
	}